

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify-tool.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  uchar *data;
  char *pubkey;
  char *sig;
  char *__s;
  size_t file_len;
  size_t local_30;
  
  if (argc != 4) {
    puts("DSA verification tool");
    puts("Usage: ./dsa-verify <file> <public key> <signature>");
    return -1;
  }
  data = (uchar *)read_file(argv[1],&local_30);
  pubkey = read_file(argv[2],(size_t *)0x0);
  sig = read_file(argv[3],(size_t *)0x0);
  iVar1 = dsa_verify_blob(data,local_30,pubkey,sig);
  if (iVar1 == 1) {
    __s = "Verification OK";
  }
  else {
    puts("Verification FAILED");
    if (3 < iVar1 + 5U) goto LAB_00102350;
    __s = &DAT_0010a0d0 + *(int *)(&DAT_0010a0d0 + (ulong)(iVar1 + 5U) * 4);
  }
  puts(__s);
LAB_00102350:
  free(data);
  free(pubkey);
  free(sig);
  return (uint)(iVar1 != 1);
}

Assistant:

int main(int argc, char* argv[])
{
	if(argc != 4)
	{
		puts("DSA verification tool");
		puts("Usage: ./dsa-verify <file> <public key> <signature>");
		return -1;
	}

	size_t file_len;
	char* file_contents = read_file(argv[1], &file_len);
	char* public_key = read_file(argv[2], NULL);
	char* signature = read_file(argv[3], NULL);

	int ret = dsa_verify_blob((const unsigned char*)file_contents, file_len, public_key, signature);

	if (ret == DSA_VERIFICATION_OK)
		puts("Verification OK");
	else
	{
		puts("Verification FAILED");

		switch (ret)
		{
			case DSA_VERIFICATION_FAILED: break;
			case DSA_KEY_PARAM_ERROR: puts("Key is invalid!"); break;
			case DSA_SIGNATURE_PARAM_ERROR: puts("Signature is invalid!"); break;
			case DSA_KEY_FORMAT_ERROR: puts("Key format is invalid!"); break;
			case DSA_SIGNATURE_FORMAT_ERROR: puts("Signature format is invalid!"); break;
		}
	}

	free(file_contents);
	free(public_key);
	free(signature);

	return !(ret == DSA_VERIFICATION_OK);
}